

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zgscon.c
# Opt level: O1

void zgscon(char *norm,SuperMatrix *L,SuperMatrix *U,double anorm,double *rcond,SuperLUStat_t *stat,
           int *info)

{
  byte bVar1;
  int *info_00;
  SuperLUStat_t *stat_00;
  doublecomplex *x;
  char *diag;
  char *trans;
  char *uplo;
  int iVar2;
  int kase;
  int *local_168;
  int local_160;
  int nrow;
  SuperLUStat_t *local_158;
  double ainvnm;
  double local_148;
  double *local_140;
  int isave [3];
  
  *info = 0;
  bVar1 = *norm;
  iVar2 = -1;
  if ((bVar1 - 0x31 < 0x1f) && ((0x41000001U >> (bVar1 - 0x31 & 0x1f) & 1) != 0)) {
    iVar2 = -2;
    if ((-1 < L->nrow) &&
       ((((L->nrow == L->ncol && (L->Stype == SLU_SC)) && (L->Dtype == SLU_Z)) &&
        (L->Mtype == SLU_TRLU)))) {
      iVar2 = -3;
      if ((((-1 < U->nrow) && (U->nrow == U->ncol)) && (U->Stype == SLU_NC)) &&
         ((U->Dtype == SLU_Z && (U->Mtype == SLU_TRU)))) goto LAB_00116774;
    }
  }
  *info = iVar2;
LAB_00116774:
  local_168 = info;
  local_158 = stat;
  if (*info == 0) {
    *rcond = 0.0;
    if (((long)L->nrow == 0) || (U->nrow == 0)) {
      *rcond = 1.0;
    }
    else {
      local_148 = anorm;
      local_140 = rcond;
      x = doublecomplexCalloc((long)L->nrow * 3);
      if (x == (doublecomplex *)0x0) {
        sprintf((char *)isave,"%s at line %d in file %s\n","Malloc fails for work arrays in zgscon."
                ,0x7f,
                "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/zgscon.c")
        ;
        superlu_abort_and_exit((char *)isave);
      }
      ainvnm = 0.0;
      iVar2 = 2 - (uint)(bVar1 == 0x31 || bVar1 == 0x4f);
      kase = 0;
      nrow = L->nrow;
      local_160 = iVar2;
      do {
        zlacon2_(&nrow,x + L->nrow,x,&ainvnm,&kase,isave);
        stat_00 = local_158;
        info_00 = local_168;
        if (kase == 0) break;
        if (kase == iVar2) {
          sp_ztrsv("L","No trans","Unit",L,U,x,local_158,local_168);
          uplo = "U";
          trans = "No trans";
          diag = "Non-unit";
          iVar2 = local_160;
        }
        else {
          sp_ztrsv("U","Transpose","Non-unit",L,U,x,local_158,local_168);
          uplo = "L";
          trans = "Transpose";
          diag = "Unit";
        }
        sp_ztrsv(uplo,trans,diag,L,U,x,stat_00,info_00);
      } while (kase != 0);
      if ((ainvnm != 0.0) || (NAN(ainvnm))) {
        *local_140 = (1.0 / ainvnm) / local_148;
      }
      superlu_free(x);
    }
  }
  else {
    isave[0] = -*info;
    input_error("zgscon",isave);
  }
  return;
}

Assistant:

void
zgscon(char *norm, SuperMatrix *L, SuperMatrix *U,
       double anorm, double *rcond, SuperLUStat_t *stat, int *info)
{


    /* Local variables */
    int    kase, kase1, onenrm;
    double ainvnm;
    doublecomplex *work;
    int    isave[3];
    extern int zrscl_(int *, doublecomplex *, doublecomplex *, int *);

    extern int zlacon2_(int *, doublecomplex *, doublecomplex *, double *, int *, int []);

    
    /* Test the input parameters. */
    *info = 0;
    onenrm = *(unsigned char *)norm == '1' || strncmp(norm, "O", 1)==0;
    if (! onenrm && strncmp(norm, "I", 1)!=0) *info = -1;
    else if (L->nrow < 0 || L->nrow != L->ncol ||
             L->Stype != SLU_SC || L->Dtype != SLU_Z || L->Mtype != SLU_TRLU)
	 *info = -2;
    else if (U->nrow < 0 || U->nrow != U->ncol ||
             U->Stype != SLU_NC || U->Dtype != SLU_Z || U->Mtype != SLU_TRU) 
	*info = -3;
    if (*info != 0) {
	int ii = -(*info);
	input_error("zgscon", &ii);
	return;
    }

    /* Quick return if possible */
    *rcond = 0.;
    if ( L->nrow == 0 || U->nrow == 0) {
	*rcond = 1.;
	return;
    }

    work = doublecomplexCalloc( 3*L->nrow );


    if ( !work )
	ABORT("Malloc fails for work arrays in zgscon.");
    
    /* Estimate the norm of inv(A). */
    ainvnm = 0.;
    if ( onenrm ) kase1 = 1;
    else kase1 = 2;
    kase = 0;

    int nrow = L->nrow;

    do {
	zlacon2_(&nrow, &work[L->nrow], &work[0], &ainvnm, &kase, isave);

	if (kase == 0) break;

	if (kase == kase1) {
	    /* Multiply by inv(L). */
	    sp_ztrsv("L", "No trans", "Unit", L, U, &work[0], stat, info);

	    /* Multiply by inv(U). */
	    sp_ztrsv("U", "No trans", "Non-unit", L, U, &work[0], stat, info);
	    
	} else {

	    /* Multiply by inv(U'). */
	    sp_ztrsv("U", "Transpose", "Non-unit", L, U, &work[0], stat, info);

	    /* Multiply by inv(L'). */
	    sp_ztrsv("L", "Transpose", "Unit", L, U, &work[0], stat, info);
	    
	}

    } while ( kase != 0 );

    /* Compute the estimate of the reciprocal condition number. */
    if (ainvnm != 0.) *rcond = (1. / ainvnm) / anorm;

    SUPERLU_FREE (work);
    return;

}